

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

uint8_t * basist::get_anchor_indices
                    (uint32_t subsets,uint32_t mode,uint32_t common_pattern,
                    uint8_t **pPartition_pattern)

{
  long lVar1;
  uint8_t *puVar2;
  long lVar3;
  
  puVar2 = "";
  *pPartition_pattern = "";
  if (1 < subsets) {
    lVar1 = (ulong)common_pattern * 3;
    lVar3 = (ulong)common_pattern * 0x10;
    if (subsets == 3) {
      *pPartition_pattern = g_astc_bc7_patterns3 + lVar3;
      return g_astc_bc7_pattern3_anchors + lVar1;
    }
    if (mode == 7) {
      *pPartition_pattern = g_bc7_3_astc2_patterns2 + lVar3;
      return g_bc7_3_astc2_patterns2_anchors + lVar1;
    }
    *pPartition_pattern = g_astc_bc7_patterns2 + lVar3;
    puVar2 = g_astc_bc7_pattern2_anchors + lVar1;
  }
  return puVar2;
}

Assistant:

const uint8_t* get_anchor_indices(uint32_t subsets, uint32_t mode, uint32_t common_pattern, const uint8_t*& pPartition_pattern)
	{
		const uint8_t* pSubset_anchor_indices = g_zero_pattern;
		pPartition_pattern = g_zero_pattern;

		if (subsets >= 2)
		{
			if (subsets == 3)
			{
				pPartition_pattern = &g_astc_bc7_patterns3[common_pattern][0];
				pSubset_anchor_indices = &g_astc_bc7_pattern3_anchors[common_pattern][0];
			}
			else if (mode == 7)
			{
				pPartition_pattern = &g_bc7_3_astc2_patterns2[common_pattern][0];
				pSubset_anchor_indices = &g_bc7_3_astc2_patterns2_anchors[common_pattern][0];
			}
			else
			{
				pPartition_pattern = &g_astc_bc7_patterns2[common_pattern][0];
				pSubset_anchor_indices = &g_astc_bc7_pattern2_anchors[common_pattern][0];
			}
		}

		return pSubset_anchor_indices;
	}